

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O2

int run_many_negation_range_tests_simpler(_Bool inplace)

{
  _Bool _Var1;
  uint8_t typecode;
  _Bool _Var2;
  uint uVar3;
  uint uVar4;
  ulong in_RAX;
  run_container_t *src;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int x_1;
  ulong uVar11;
  ulong uVar12;
  int x;
  int iVar13;
  bool bVar14;
  container_t *BO;
  int iStack_10068;
  uint uStack_10064;
  ulong uStack_10060;
  ulong uStack_10058;
  ulong uStack_10050;
  ulong uStack_10048;
  ulong uStack_10040;
  _Bool result_should_be [65536];
  
  for (uVar11 = 1; (uint)uVar11 < 100; uVar11 = (ulong)(uint)((int)uVar11 * 3)) {
    uVar3 = printf("h=%d\n",uVar11);
    in_RAX = (ulong)uVar3;
    uStack_10060 = uVar11;
    for (uVar3 = (uint)uVar11 + 1; (int)uVar3 < 100; uVar3 = (uint)((double)(int)uVar3 * 1.5 + 1.0))
    {
      printf("  k=%d\n",(ulong)uVar3);
      in_RAX = (ulong)((int)uVar11 < (int)uVar3);
      uStack_10050 = in_RAX;
      for (uVar12 = 0; uVar8 = (uint)uVar12, (int)uVar8 < 1000;
          uVar12 = (ulong)(uint)(int)((double)(int)uVar12 * 2.7 + 1.0)) {
        uStack_10064 = ~uVar8;
        iStack_10068 = uVar8 + 1;
        in_RAX = 0;
        uStack_10048 = uVar12;
        while (in_RAX < 0xffff) {
          uVar6 = 0;
          uStack_10058 = in_RAX;
          while (iVar7 = (int)uVar6 + (int)uStack_10058, iVar7 < 0x10000) {
            iVar13 = 0;
            uStack_10040 = uVar6;
            src = run_container_create_given_capacity((int)(0x10000 / (long)(int)uVar3) + 1);
            _assert_true(uStack_10050,"h < k",
                         "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                         ,0x67d);
            uVar6 = uVar11 & 0xffffffff;
            uVar12 = uVar12 & 0xffffffff;
            iVar5 = iStack_10068;
            uVar8 = uStack_10064;
            while (uVar9 = (uint)uVar12, uVar9 != 0x10000) {
              if (iVar13 % (int)uVar3 == 0) {
                uVar4 = (int)uVar6 + 1;
                iVar10 = (int)uVar6 + iVar5;
                if (0xffff < iVar10) {
                  iVar10 = 0;
                }
                src->runs[src->n_runs] = (rle16_t)(uVar9 & 0xffff | (iVar10 + uVar8) * 0x10000);
                src->n_runs = src->n_runs + 1;
                if (uVar4 == uVar3) {
                  uVar4 = (uint)uVar11;
                }
                uVar6 = (ulong)uVar4;
              }
              iVar13 = iVar13 + 1;
              uVar8 = uVar8 - 1;
              iVar5 = iVar5 + 1;
              uVar12 = (ulong)(uVar9 + 1);
            }
            uVar8 = 0;
            for (uVar11 = 0; uVar11 != 0x10000; uVar11 = uVar11 + 1) {
              bVar14 = uStack_10058 <= uVar11;
              _Var1 = run_container_contains(src,(uint16_t)uVar11);
              bVar14 = _Var1 != ((long)uVar11 < (long)iVar7 && bVar14);
              uVar8 = uVar8 + bVar14;
              result_should_be[uVar11] = bVar14;
            }
            if (inplace) {
              iVar7 = run_container_negation_range_inplace(src,(int)uStack_10058,iVar7,&BO);
              typecode = (uint8_t)iVar7;
            }
            else {
              iVar7 = run_container_negation_range(src,(int)uStack_10058,iVar7,&BO);
              typecode = (uint8_t)iVar7;
            }
            uVar11 = uStack_10060;
            iVar7 = container_get_cardinality(BO,typecode);
            _assert_int_equal((ulong)uVar8,(long)iVar7,
                              "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                              ,0x6a1);
            for (uVar12 = 0; uVar12 != 0x10000; uVar12 = uVar12 + 1) {
              _Var2 = container_contains(BO,(uint16_t)uVar12,typecode);
              _Var1 = result_should_be[uVar12];
              if (_Var1 != _Var2) {
                printf("problem at index %d should be (but isnt) %d\n",uVar12 & 0xffffffff,
                       (ulong)(uint)_Var1);
              }
              _Var2 = container_contains(BO,(uint16_t)uVar12,typecode);
              _assert_int_equal((ulong)_Var2,(ulong)(uint)_Var1,
                                "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                                ,0x6ab);
            }
            container_free(BO,typecode);
            if (!inplace) {
              run_container_free(src);
            }
            uVar12 = uStack_10048;
            uVar6 = (ulong)((int)uStack_10040 * 3 + 1);
          }
          in_RAX = uStack_10058 + 0x271d;
        }
      }
    }
  }
  return (int)in_RAX;
}

Assistant:

static int run_many_negation_range_tests_simpler(bool inplace) {
    for (int h = 1; h < 100; h *= 3) {
        printf("h=%d\n", h);
        for (int k = h + 1; k < 100; k = k * 1.5 + 1) {
            printf("  k=%d\n", k);
            for (int start_offset = 0; start_offset < 1000;
                 start_offset = start_offset * 2.7 + 1) {
                for (int r_start = 0; r_start < 65535; r_start += 10013)
                    for (int span = 0; r_start + span < 65536;
                         span = span * 3 + 1) {
                        run_negation_range_tests_simpler(
                            k, h, start_offset, r_start, r_start + span,
                            inplace);
                    }
            }
        }
    }
    return 1;
}